

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_base<SequenceDistanceGraphPath>::src_and_type(itype *src)

{
  bool bVar1;
  SequenceDistanceGraphPath *in_RDI;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  type_info *tpi;
  void *vsrc;
  type_info *instance_type;
  type_info *cast_type;
  undefined7 in_stack_00000050;
  bool in_stack_00000057;
  type_info *in_stack_00000058;
  void *in_stack_00000060;
  type_info *in_stack_ffffffffffffffb8;
  type_index in_stack_ffffffffffffffc0;
  type_info *local_38;
  void *local_30;
  type_info *local_28;
  pointer_____offset_0x10___ *local_20;
  pair<const_void_*,_const_pybind11::detail::type_info_*> local_10;
  
  local_20 = &SequenceDistanceGraphPath::typeinfo;
  local_28 = (type_info *)0x0;
  local_30 = polymorphic_type_hook_base<SequenceDistanceGraphPath,_void>::get(in_RDI,&local_28);
  if ((local_28 != (type_info *)0x0) &&
     (bVar1 = same_type(in_stack_ffffffffffffffc0._M_target,in_stack_ffffffffffffffb8), !bVar1)) {
    std::type_index::type_index((type_index *)&stack0xffffffffffffffc0,local_28);
    local_38 = get_type_info((type_index *)in_stack_00000058,in_stack_00000057);
    if (local_38 != (type_info *)0x0) {
      std::pair<const_void_*,_const_pybind11::detail::type_info_*>::
      pair<const_void_*&,_const_pybind11::detail::type_info_*&,_true>(&local_10,&local_30,&local_38)
      ;
      return local_10;
    }
    local_38 = (type_info *)0x0;
  }
  pVar2 = type_caster_generic::src_and_type
                    (in_stack_00000060,in_stack_00000058,
                     (type_info *)CONCAT17(in_stack_00000057,in_stack_00000050));
  return pVar2;
}

Assistant:

static std::pair<const void *, const type_info *> src_and_type(const itype *src) {
        auto &cast_type = typeid(itype);
        const std::type_info *instance_type = nullptr;
        const void *vsrc = polymorphic_type_hook<itype>::get(src, instance_type);
        if (instance_type && !same_type(cast_type, *instance_type)) {
            // This is a base pointer to a derived type. If the derived type is registered
            // with pybind11, we want to make the full derived object available.
            // In the typical case where itype is polymorphic, we get the correct
            // derived pointer (which may be != base pointer) by a dynamic_cast to
            // most derived type. If itype is not polymorphic, we won't get here
            // except via a user-provided specialization of polymorphic_type_hook,
            // and the user has promised that no this-pointer adjustment is
            // required in that case, so it's OK to use static_cast.
            if (const auto *tpi = get_type_info(*instance_type))
                return {vsrc, tpi};
        }
        // Otherwise we have either a nullptr, an `itype` pointer, or an unknown derived pointer, so
        // don't do a cast
        return type_caster_generic::src_and_type(src, cast_type, instance_type);
    }